

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall OpenMD::SimInfo::getGlobalAtomIndices(SimInfo *this)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  SimInfo *in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  Atom *atom;
  AtomIterator ai;
  Molecule *mol;
  MoleculeIterator mi;
  vector<int,_std::allocator<int>_> *GlobalAtomIndices;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  value_type_conflict2 *in_stack_ffffffffffffff80;
  vector<int,_std::allocator<int>_> *i;
  Atom *local_30;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_28;
  Molecule *local_20;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_18 [3];
  
  i = in_RDI;
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_18);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_28);
  getNAtoms(in_RSI);
  std::allocator<int>::allocator((allocator<int> *)0x14f5e5);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_RSI,(size_type)i,in_stack_ffffffffffffff80,
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  std::allocator<int>::~allocator((allocator<int> *)0x14f60a);
  local_20 = beginMolecule(in_RSI,(MoleculeIterator *)i);
  while (local_20 != (Molecule *)0x0) {
    local_30 = Molecule::beginAtom((Molecule *)in_RSI,(iterator *)i);
    while (local_30 != (Atom *)0x0) {
      iVar1 = StuntDouble::getGlobalIndex(&local_30->super_StuntDouble);
      iVar2 = StuntDouble::getLocalIndex(&local_30->super_StuntDouble);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,(long)iVar2);
      *pvVar3 = iVar1;
      local_30 = Molecule::nextAtom((Molecule *)in_RSI,(iterator *)i);
    }
    local_20 = nextMolecule(in_RSI,(MoleculeIterator *)i);
  }
  return i;
}

Assistant:

vector<int> SimInfo::getGlobalAtomIndices() {
    SimInfo::MoleculeIterator mi;
    Molecule* mol;
    Molecule::AtomIterator ai;
    Atom* atom;

    vector<int> GlobalAtomIndices(getNAtoms(), 0);

    for (mol = beginMolecule(mi); mol != NULL; mol = nextMolecule(mi)) {
      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        GlobalAtomIndices[atom->getLocalIndex()] = atom->getGlobalIndex();
      }
    }
    return GlobalAtomIndices;
  }